

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *command_line_00;
  _Bool _Var1;
  uint uVar2;
  FILE *__stream;
  char **ppcVar3;
  int local_11c8;
  byte local_11c1;
  int i_1;
  _Bool info;
  uint bank_index;
  int ticked;
  unsigned_long_long n;
  _Bool run;
  char *command_line_1;
  char *newline;
  char command_line [200];
  char *local_10c8;
  char *previous_command_line;
  int i;
  em8051 *emu;
  em8051 _emu;
  size_t ret;
  FILE *f;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    __assert_fail("argc > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JayFoxRox[P]mtk-odd-emulator/main.c"
                  ,0x106,"int main(int, char **)");
  }
  __stream = fopen(argv[1],"rb");
  _emu._4224_8_ = fread(flash,1,0x20000,__stream);
  if (_emu._4224_8_ != 0x20000) {
    __assert_fail("ret == sizeof(flash)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JayFoxRox[P]mtk-odd-emulator/main.c"
                  ,0x109,"int main(int, char **)");
  }
  fclose(__stream);
  memset(&emu,0,0x1088);
  emu = (em8051 *)malloc(0x10000);
  _emu.mCodeMem._0_4_ = 0x10000;
  _emu._8_8_ = malloc(0x10000);
  _emu.mExtData._0_4_ = 0x10000;
  _emu._24_8_ = malloc(0x100);
  _emu.mLowerData = (uchar *)(_emu._24_8_ + 0x80);
  _emu.mUpperData = (uchar *)malloc(0x80);
  _emu.dec[0xff] = emu_exception;
  _emu.except = emu_sfrread;
  _emu.sfrread = sfrwrite;
  _emu.sfrwrite = xread;
  _emu.xread = xwrite;
  reset((em8051 *)&emu,1);
  load_bank((em8051 *)&emu);
  for (previous_command_line._4_4_ = 2; previous_command_line._4_4_ < argc;
      previous_command_line._4_4_ = previous_command_line._4_4_ + 1) {
    add_command(argv[previous_command_line._4_4_]);
  }
  install_pause_handler();
  local_10c8 = strdup("");
  do {
    if (((requested_pause & 1U) != 0) && (command_count == 0)) {
      printf("> ");
      fgets((char *)&newline,200,_stdin);
      ppcVar3 = (char **)strchr((char *)&newline,10);
      if (ppcVar3 == &newline) {
        strcpy((char *)&newline,local_10c8);
      }
      else {
        *(char *)ppcVar3 = '\0';
        free(local_10c8);
        local_10c8 = strdup((char *)&newline);
      }
      add_command((char *)&newline);
    }
    do {
      if (command_count == 0) goto LAB_00102f5b;
      command_line_00 = *commands;
      printf("Command \'%s\'\n",command_line_00);
      _Var1 = handle_command((em8051 *)&emu,command_line_00);
      delete_command();
    } while (!_Var1);
    requested_pause = false;
LAB_00102f5b:
    _bank_index = 1;
    while (((requested_pause ^ 0xffU) & 1) != 0) {
      if ((steps != 0xffffffff) && (steps = steps - 1, steps == 0)) {
        requested_pause = true;
      }
      tick((em8051 *)&emu);
      uVar2 = _emu.mUpperData[0x10] & 1;
      local_11c1 = trace & 1;
      if ((_emu.mUpperData[0x10] & 1) == 0) {
        if ((uint)_emu.mSFR == 0x23bb) {
          printf("Trying to find ATAPI handler\n");
        }
        else if ((uint)_emu.mSFR == 0x27e2) {
          printf("Setting sense: SK=%02X ASQ=%02X ASQC=%02X\n",
                 (ulong)*(byte *)(_emu._24_8_ +
                                 (long)(((int)(_emu.mUpperData[0x50] & 0x18) >> 3) * 8 + 7)),
                 (ulong)*(byte *)(_emu._24_8_ +
                                 (long)(((int)(_emu.mUpperData[0x50] & 0x18) >> 3) * 8 + 5)),
                 (ulong)*(byte *)(_emu._24_8_ +
                                 (long)(((int)(_emu.mUpperData[0x50] & 0x18) >> 3) * 8 + 3)));
        }
      }
      if ((uVar2 == 1) && ((uint)_emu.mSFR - 0x2394 < 0x36)) {
        local_11c1 = 0;
      }
      if (local_11c1 != 0) {
        printf("bank %d: 0x%04X",(ulong)uVar2,(ulong)(uint)_emu.mSFR);
        printf(" R6: 0x%02X",
               (ulong)*(byte *)(_emu._24_8_ +
                               (long)(((int)(_emu.mUpperData[0x50] & 0x18) >> 3) * 8 + 6)));
        printf(" R4R5: 0x%02X%02X",
               (ulong)*(byte *)(_emu._24_8_ +
                               (long)(((int)(_emu.mUpperData[0x50] & 0x18) >> 3) * 8 + 4)),
               (ulong)*(byte *)(_emu._24_8_ +
                               (long)(((int)(_emu.mUpperData[0x50] & 0x18) >> 3) * 8 + 5)));
        printf(" interrupt-active:%d",(ulong)(uint)_emu.xwrite);
        printf(" IE.EA:%d",(ulong)(_emu.mUpperData[0x28] & 0x80));
        printf(" IE.EX1:%d",(ulong)(_emu.mUpperData[0x28] & 4));
        printf(" TCON.IE1:%d",(ulong)(_emu.mUpperData[8] & 8));
        printf(" IP.PX1:%d",(ulong)(_emu.mUpperData[0x38] & 4));
        printf(" P1.5:%d",(ulong)((int)(uint)_emu.mUpperData[0x10] >> 5 & 1));
        printf(" P1.6:%d",(ulong)((int)(uint)_emu.mUpperData[0x10] >> 6 & 1));
        printf(" flash-state:%d/%d",(ulong)flash_state,(ulong)(flash_chip_id & 1));
        printf(" SCSI:");
        for (local_11c8 = 0; local_11c8 < scsi_count; local_11c8 = local_11c8 + 1) {
          printf("%02X",(ulong)scsi_buffer[local_11c8]);
        }
        printf(" %llu",_bank_index);
        printf("\n");
      }
      _bank_index = _bank_index + 1;
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {

  // Load the firmware
  //FIXME: Turn into a command
  assert(argc > 1);
  FILE* f = fopen(argv[1], "rb");
  size_t ret = fread(flash, 1, sizeof(flash), f);
  assert(ret == sizeof(flash));
  fclose(f);

  // Create the virtual CPU
  struct em8051 _emu;
  memset(&_emu, 0, sizeof(_emu));

  // Set up virtual CPU
  struct em8051* emu = &_emu;
  emu->mCodeMem     = malloc(0x10000);
  emu->mCodeMemSize = 0x10000;
  emu->mExtData     = malloc(0x10000);
  emu->mExtDataSize = 0x10000;
  emu->mLowerData   = malloc(0x100);
  emu->mUpperData   = &emu->mLowerData[0x80];
  emu->mSFR         = malloc(0x80);
  emu->except       = emu_exception;
  emu->sfrread      = emu_sfrread;
  emu->sfrwrite = sfrwrite;
  emu->xread = xread;
  emu->xwrite = xwrite;

  // Reset virtual CPU
  reset(emu, 1);

  // Load bank 0 of firmware to memory
  load_bank(emu);

  // Process commands from command line
  for(int i = 2; i < argc; i++) {
    add_command(argv[i]);
  }

  // Enable pausing of emulator  
  install_pause_handler();


  // Start mainloop
  char* previous_command_line = strdup("");
  while(true) {

    // Check if we have to enter the shell
    if (requested_pause) {

      // Only handle pause if we no longer have anything queued
      if (command_count == 0) {

        printf("> ");
        char command_line[200];
        fgets(command_line, sizeof(command_line), stdin);

        char* newline = strchr(command_line, '\n');
        if (newline == command_line) {
          strcpy(command_line, previous_command_line);
        } else {
          *newline = '\0';

          free(previous_command_line);
          previous_command_line = strdup(command_line);
        }

        //FIXME: Split line by ;
        add_command(command_line);
      }

    }

    // Process all queued commands until we are supposed to run
    while(command_count > 0) {
      char* command_line = commands[0];
      printf("Command '%s'\n", command_line);
      bool run = handle_command(emu, command_line);
      delete_command();
      if (run) {
        requested_pause = false;
        break;
      }
    }

    // Run the CPU
    unsigned long long n = 1;
    while(!requested_pause) {

      // Use step counter
      if (steps != (unsigned int)-1) {
        steps--;
        if (steps == 0) {
          requested_pause = true;
        }
      }

      int ticked = tick(emu);
      unsigned int bank_index = emu->mSFR[REG_P1] & 1;

      bool info = trace;

      if (bank_index == 0) {
        switch(emu->mPC) {
        case 0x27e2:
          printf("Setting sense: SK=%02X ASQ=%02X ASQC=%02X\n", RX(7), RX(5), RX(3));
          //assert(false);
          break;
        case 0x23bb:
          printf("Trying to find ATAPI handler\n");
          break;
        }
      }

      if (bank_index == 1) {
        switch(emu->mPC) {

        case 0x2394 ... 0x23C9:
          // This is a rather tight loop that takes a while
          info = false;
          break;

        }
      }

      if(info) {
        printf("bank %d: 0x%04X", bank_index, emu->mPC);
        printf(" R6: 0x%02X", RX(6));
        printf(" R4R5: 0x%02X%02X", RX(4), RX(5));
        printf(" interrupt-active:%d", emu->mInterruptActive);
        printf(" IE.EA:%d", emu->mSFR[REG_IE] & IEMASK_EA);
        printf(" IE.EX1:%d", emu->mSFR[REG_IE] & IEMASK_EX1);
        printf(" TCON.IE1:%d", emu->mSFR[REG_TCON] & TCONMASK_IE1);
        printf(" IP.PX1:%d", emu->mSFR[REG_IP] & IPMASK_PX1);
        printf(" P1.5:%d", (emu->mSFR[REG_P1] >> 5) & 1);
        printf(" P1.6:%d", (emu->mSFR[REG_P1] >> 6) & 1);
        printf(" flash-state:%d/%d", flash_state, flash_chip_id);
        printf(" SCSI:");
        for(int i = 0; i < scsi_count; i++) {
          printf("%02X", scsi_buffer[i]);
        }
        printf(" %llu", n);
        printf("\n");
      }

      n++;

    }

  }

  return 0;
}